

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void * __thiscall tinyxml2::MemPoolT<80>::Alloc(MemPoolT<80> *this)

{
  int iVar1;
  int iVar2;
  Item *__s;
  Item *pIVar3;
  long lVar4;
  
  __s = this->_root;
  if (__s == (Item *)0x0) {
    __s = (Item *)operator_new(0xff0);
    memset(__s,0,0xff0);
    DynArray<tinyxml2::MemPoolT<80>::Block_*,_10>::EnsureCapacity
              (&this->_blockPtrs,(this->_blockPtrs)._size + 1);
    iVar1 = (this->_blockPtrs)._size;
    (this->_blockPtrs)._mem[iVar1] = (Block *)__s;
    (this->_blockPtrs)._size = iVar1 + 1;
    lVar4 = 0x32;
    pIVar3 = __s;
    do {
      pIVar3->next = pIVar3 + 1;
      lVar4 = lVar4 + -1;
      pIVar3 = pIVar3 + 1;
    } while (lVar4 != 0);
    __s[0x32].next = (Item *)0x0;
    this->_root = __s;
  }
  this->_root = __s->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return __s;
}

Assistant:

virtual void* Alloc()
    {
        if (!_root) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push(block);

            Item* blockItems = block->items;
            for (int i = 0; i < ITEMS_PER_BLOCK - 1; ++i) {
                blockItems[i].next = &(blockItems[i + 1]);
            }
            blockItems[ITEMS_PER_BLOCK - 1].next = 0;
            _root = blockItems;
        }
        Item* const result = _root;
        TIXMLASSERT(result != 0);
        _root = _root->next;

        ++_currentAllocs;
        if (_currentAllocs > _maxAllocs) {
            _maxAllocs = _currentAllocs;
        }
        ++_nAllocs;
        ++_nUntracked;
        return result;
    }